

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathEvalExpr(xmlXPathParserContextPtr ctxt)

{
  xmlXPathCompExprPtr pxVar1;
  xmlXPathCompExprPtr comp;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  pxVar1 = xmlXPathTryStreamCompile(ctxt->context,ctxt->base);
  if (pxVar1 == (xmlXPathCompExprPtr)0x0) {
    if (ctxt->context != (xmlXPathContextPtr)0x0) {
      ctxt->context->depth = 0;
    }
    xmlXPathCompileExpr(ctxt,1);
    if (ctxt->error != 0) {
      return;
    }
    if (*ctxt->cur != '\0') {
      xmlXPathErr(ctxt,7);
      return;
    }
    if ((1 < ctxt->comp->nbStep) && (-1 < ctxt->comp->last)) {
      if (ctxt->context != (xmlXPathContextPtr)0x0) {
        ctxt->context->depth = 0;
      }
      xmlXPathOptimizeExpression(ctxt,ctxt->comp->steps + ctxt->comp->last);
    }
  }
  else {
    if (ctxt->comp != (xmlXPathCompExprPtr)0x0) {
      xmlXPathFreeCompExpr(ctxt->comp);
    }
    ctxt->comp = pxVar1;
  }
  xmlXPathRunEval(ctxt,0);
  return;
}

Assistant:

void
xmlXPathEvalExpr(xmlXPathParserContextPtr ctxt) {
#ifdef XPATH_STREAMING
    xmlXPathCompExprPtr comp;
#endif

    if (ctxt == NULL) return;

#ifdef XPATH_STREAMING
    comp = xmlXPathTryStreamCompile(ctxt->context, ctxt->base);
    if (comp != NULL) {
        if (ctxt->comp != NULL)
	    xmlXPathFreeCompExpr(ctxt->comp);
        ctxt->comp = comp;
    } else
#endif
    {
        if (ctxt->context != NULL)
            ctxt->context->depth = 0;
	xmlXPathCompileExpr(ctxt, 1);
        CHECK_ERROR;

        /* Check for trailing characters. */
        if (*ctxt->cur != 0)
            XP_ERROR(XPATH_EXPR_ERROR);

	if ((ctxt->comp->nbStep > 1) && (ctxt->comp->last >= 0)) {
            if (ctxt->context != NULL)
                ctxt->context->depth = 0;
	    xmlXPathOptimizeExpression(ctxt,
		&ctxt->comp->steps[ctxt->comp->last]);
        }
    }

    xmlXPathRunEval(ctxt, 0);
}